

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::clear
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *this)

{
  this->numActive = 0;
  freeIfHeapAllocated(this);
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }